

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O3

void addTests_Image_Buffer(UnitTestFramework *framework)

{
  ulong *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  string local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  paVar3 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"template_image::EmptyConstructor","");
  UnitTestFramework::add(framework,template_image::EmptyConstructor,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"template_image::Constructor","");
  UnitTestFramework::add(framework,template_image::Constructor,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"template_image::NullAssignment","");
  UnitTestFramework::add(framework,template_image::NullAssignment,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_001386e7;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_001386e7:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  local_150 = &local_140;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_001387cd;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001387cd:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  local_130 = &local_120;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_001388ae;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_001388ae:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  local_110 = &local_100;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_00138987;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00138987:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_char>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_00138b62;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00138b62:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_00138c40;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00138c40:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_00138d1a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00138d1a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_00138de5;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00138de5:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_short>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_00138fc0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00138fc0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013909e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013909e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_00139178;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00139178:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_00139243;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00139243:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_int>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013941e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013941e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_001394fc;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001394fc:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_001395d6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_001395d6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_001396a1;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_001396a1:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_long>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013987c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013987c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013995a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013995a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_00139a34;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00139a34:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_00139aff;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00139aff:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<signed_char>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_00139cda;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00139cda:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_00139db8;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00139db8:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_00139e92;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00139e92:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_00139f5d;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00139f5d:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<short>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013a138;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013a138:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013a216;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013a216:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013a2f0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013a2f0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013a3bb;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013a3bb:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<int>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013a596;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013a596:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013a674;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013a674:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013a74e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013a74e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013a819;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013a819:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<long>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013a9f4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013a9f4:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013aad2;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013aad2:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"float","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013abac;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013abac:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013ac77;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013ac77:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<float>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013ae52;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013ae52:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013af30;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013af30:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"double","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013b00a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013b00a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013b0d5;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013b0d5:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<double>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013b2b0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013b2b0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013b38e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013b38e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013b468;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013b468:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013b533;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013b533:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_char>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013b70e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013b70e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013b7ec;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013b7ec:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013b8c6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013b8c6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013b991;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013b991:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_short>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013bb6c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013bb6c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013bc4a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013bc4a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013bd24;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013bd24:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013bdef;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013bdef:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_int>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013bfca;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013bfca:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013c0a8;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013c0a8:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"uint64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013c182;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013c182:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013c24d;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013c24d:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_long>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013c428;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013c428:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013c506;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013c506:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013c5e0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013c5e0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013c6ab;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013c6ab:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<signed_char>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013c886;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013c886:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013c964;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013c964:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013ca3e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013ca3e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013cb09;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013cb09:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<short>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013cce4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013cce4:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013cdc2;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013cdc2:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013ce9c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013ce9c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013cf67;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013cf67:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<int>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013d142;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013d142:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013d220;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013d220:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"int64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013d2fa;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013d2fa:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013d3c5;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013d3c5:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<long>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013d5a0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013d5a0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013d67e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013d67e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"float","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013d758;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013d758:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013d823;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013d823:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<float>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_88 + local_68)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_68)) goto LAB_0013d9fe;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013d9fe:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_a8 + local_148)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_148)) goto LAB_0013dadc;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013dadc:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"double","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_c8 + local_128)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_128)) goto LAB_0013dbb6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013dbb6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if ((ulong)(local_48 + local_108) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
      goto LAB_0013dc9e;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
LAB_0013dc9e:
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = puVar4[3];
    local_f0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<double>,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void addTests_Image_Buffer( UnitTestFramework & framework )
{
    ADD_TEST( framework, template_image::EmptyConstructor );
    ADD_TEST( framework, template_image::Constructor );
    ADD_TEST( framework, template_image::NullAssignment );

    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, float );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, double );

    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, float );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, double );
}